

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MappedPointerVector.hpp
# Opt level: O0

void __thiscall
gmlc::containers::MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle>::clear
          (MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle> *this)

{
  std::
  vector<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>,_std::allocator<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>_>_>
  ::clear((vector<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>,_std::allocator<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>_>_>
           *)0x661b38);
  std::
  unordered_map<helics::GlobalHandle,_unsigned_long,_std::hash<helics::GlobalHandle>,_std::equal_to<helics::GlobalHandle>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>_>
  ::clear((unordered_map<helics::GlobalHandle,_unsigned_long,_std::hash<helics::GlobalHandle>,_std::equal_to<helics::GlobalHandle>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>_>
           *)0x661b46);
  return;
}

Assistant:

void clear()
    {
        dataStorage.clear();
        lookup.clear();
    }